

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void * TempChangeHandler(void *service)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_29;
  
  if ((TempChangeHandler(void*)::msg_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TempChangeHandler(void*)::msg_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&TempChangeHandler(void*)::msg_abi_cxx11_,"",&local_29);
    __cxa_atexit(std::__cxx11::string::~string,&TempChangeHandler(void*)::msg_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&TempChangeHandler(void*)::msg_abi_cxx11_);
  }
  do {
    uVar1 = getCoreTemp();
    sprintf(TempChangeHandler::temp_str,"%d",(ulong)uVar1);
    TempChangeHandler(void*)::msg_abi_cxx11_._M_string_length = 0;
    *TempChangeHandler(void*)::msg_abi_cxx11_._M_dataplus._M_p = '\0';
    std::__cxx11::string::append((char *)&TempChangeHandler(void*)::msg_abi_cxx11_);
    std::__cxx11::string::append((char *)&TempChangeHandler(void*)::msg_abi_cxx11_);
    fnode_service_notify_state
              ((fnode_service_t *)service,TempChangeHandler(void*)::msg_abi_cxx11_._M_dataplus._M_p,
               (uint32_t)TempChangeHandler(void*)::msg_abi_cxx11_._M_string_length);
    usleep(1000000);
  } while( true );
}

Assistant:

void* TempChangeHandler(void* service)
{
	static string msg="";
	static char temp_str[32];
	for(;;)
	{		
		sprintf(temp_str, "%d", getCoreTemp());
		msg.clear();
		msg.append("0");
		msg.append(temp_str);
		//cout << msg << endl;
		fnode_service_notify_state((fnode_service_t *)service, msg.c_str(), msg.length());
		usleep(1000000L);				
	}    
}